

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O2

void __thiscall
rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::emplace<>
          (Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> *this)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  Slot<TestType> *pSVar3;
  
  LOCK();
  paVar1 = &this->head_;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pSVar3 = this->slots_ + uVar2 % this->capacity_;
  do {
  } while ((uVar2 / this->capacity_) * 2 != (pSVar3->turn).super___atomic_base<unsigned_long>._M_i);
  TestType::TestType((TestType *)&pSVar3->storage);
  (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = (uVar2 / this->capacity_) * 2 + 1;
  return;
}

Assistant:

void emplace(Args &&...args) noexcept {
    static_assert(std::is_nothrow_constructible<T, Args &&...>::value,
                  "T must be nothrow constructible with Args&&...");
    auto const head = head_.fetch_add(1);
    auto &slot = slots_[idx(head)];
    while (turn(head) * 2 != slot.turn.load(std::memory_order_acquire))
      ;
    slot.construct(std::forward<Args>(args)...);
    slot.turn.store(turn(head) * 2 + 1, std::memory_order_release);
  }